

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessenger.cxx
# Opt level: O0

void displayMessage(MessageType t,ostringstream *msg)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  int in_ECX;
  string local_e8;
  string local_c8;
  undefined1 local_a8 [8];
  cmMessageMetadata md;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string_view local_48;
  undefined1 local_38 [8];
  string stack;
  ostringstream *msg_local;
  MessageType t_local;
  
  stack.field_2._8_8_ = msg;
  if (t == AUTHOR_WARNING) {
    std::operator<<((ostream *)msg,
                    "This warning is for project developers.  Use -Wno-dev to suppress it.");
  }
  else if (t == AUTHOR_ERROR) {
    std::operator<<((ostream *)msg,
                    "This error is for project developers. Use -Wno-error=dev to suppress it.");
  }
  std::operator<<((ostream *)stack.field_2._8_8_,"\n");
  if (t == INTERNAL_ERROR) {
    cmsys::SystemInformation::GetProgramStack_abi_cxx11_
              ((string *)local_38,(SystemInformation *)0x0,0,in_ECX);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      local_48 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
      bVar1 = cmHasLiteralPrefix<9ul>(local_48,(char (*) [9])"WARNING:");
      if (bVar1) {
        std::__cxx11::string::substr((ulong)&md.desiredColor,(ulong)local_38);
        std::operator+(&local_78,"Note:",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &md.desiredColor);
        std::__cxx11::string::operator=((string *)local_38,(string *)&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&md.desiredColor);
      }
      poVar3 = std::operator<<((ostream *)stack.field_2._8_8_,(string *)local_38);
      std::operator<<(poVar3,"\n");
    }
    std::__cxx11::string::~string((string *)local_38);
  }
  cmMessageMetadata::cmMessageMetadata((cmMessageMetadata *)local_a8);
  md.title._0_4_ = getMessageColor(t);
  if ((((t == FATAL_ERROR) || (t == INTERNAL_ERROR)) || (t == DEPRECATION_ERROR)) ||
     (t == AUTHOR_ERROR)) {
    cmSystemTools::SetErrorOccurred();
    local_a8 = (undefined1  [8])0xc5402c;
    std::__cxx11::ostringstream::str();
    cmSystemTools::Message(&local_c8,(cmMessageMetadata *)local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  else {
    local_a8 = (undefined1  [8])0xc540cb;
    std::__cxx11::ostringstream::str();
    cmSystemTools::Message(&local_e8,(cmMessageMetadata *)local_a8);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  return;
}

Assistant:

static void displayMessage(MessageType t, std::ostringstream& msg)
{
  // Add a note about warning suppression.
  if (t == MessageType::AUTHOR_WARNING) {
    msg << "This warning is for project developers.  Use -Wno-dev to suppress "
           "it.";
  } else if (t == MessageType::AUTHOR_ERROR) {
    msg << "This error is for project developers. Use -Wno-error=dev to "
           "suppress it.";
  }

  // Add a terminating blank line.
  msg << "\n";

#if !defined(CMAKE_BOOTSTRAP)
  // Add a C++ stack trace to internal errors.
  if (t == MessageType::INTERNAL_ERROR) {
    std::string stack = cmsys::SystemInformation::GetProgramStack(0, 0);
    if (!stack.empty()) {
      if (cmHasLiteralPrefix(stack, "WARNING:")) {
        stack = "Note:" + stack.substr(8);
      }
      msg << stack << "\n";
    }
  }
#endif

  // Output the message.
  cmMessageMetadata md;
  md.desiredColor = getMessageColor(t);
  if (t == MessageType::FATAL_ERROR || t == MessageType::INTERNAL_ERROR ||
      t == MessageType::DEPRECATION_ERROR || t == MessageType::AUTHOR_ERROR) {
    cmSystemTools::SetErrorOccurred();
    md.title = "Error";
    cmSystemTools::Message(msg.str(), md);
  } else {
    md.title = "Warning";
    cmSystemTools::Message(msg.str(), md);
  }
}